

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_escaped_cp<fmt::v11::basic_appender<char>,char>
          (basic_appender<char> out,find_escape_result<char> *escape)

{
  uint32_t uVar1;
  char *s;
  char c_00;
  basic_appender<char> *pbVar2;
  basic_appender<char> bVar3;
  make_unsigned_t<long> count;
  basic_appender<char> local_a8;
  find_escape_result<char> *local_a0;
  buffer<char> *local_98;
  byte local_89;
  iterator pcStack_88;
  char escape_char;
  iterator __end0;
  iterator __begin0;
  basic_string_view<char> *local_68;
  basic_string_view<char> *__range4;
  buffer<char> *local_58;
  buffer<char> *local_50;
  basic_appender<char> local_48;
  basic_appender<char> local_40;
  basic_appender<char> local_38;
  basic_appender<char> local_30;
  char local_21;
  find_escape_result<char> *pfStack_20;
  char c;
  find_escape_result<char> *escape_local;
  basic_appender<char> out_local;
  
  local_21 = (char)escape->cp;
  uVar1 = escape->cp;
  pfStack_20 = escape;
  escape_local = (find_escape_result<char> *)out.container;
  if (uVar1 == 9) {
    local_40 = basic_appender<char>::operator++((basic_appender<char> *)&escape_local,0);
    pbVar2 = basic_appender<char>::operator*(&local_40);
    basic_appender<char>::operator=(pbVar2,'\\');
    local_21 = 't';
  }
  else if (uVar1 == 10) {
    local_30 = basic_appender<char>::operator++((basic_appender<char> *)&escape_local,0);
    pbVar2 = basic_appender<char>::operator*(&local_30);
    basic_appender<char>::operator=(pbVar2,'\\');
    local_21 = 'n';
  }
  else if (uVar1 == 0xd) {
    local_38 = basic_appender<char>::operator++((basic_appender<char> *)&escape_local,0);
    pbVar2 = basic_appender<char>::operator*(&local_38);
    basic_appender<char>::operator=(pbVar2,'\\');
    local_21 = 'r';
  }
  else {
    if (((uVar1 != 0x22) && (uVar1 != 0x27)) && (uVar1 != 0x5c)) {
      if (escape->cp < 0x100) {
        local_50 = out.container;
        bVar3 = write_codepoint<2ul,char,fmt::v11::basic_appender<char>>(out,'x',escape->cp);
        return (basic_appender<char>)bVar3.container;
      }
      if (escape->cp < 0x10000) {
        local_58 = out.container;
        bVar3 = write_codepoint<4ul,char,fmt::v11::basic_appender<char>>(out,'u',escape->cp);
        return (basic_appender<char>)bVar3.container;
      }
      if (escape->cp < 0x110000) {
        __range4 = (basic_string_view<char> *)out.container;
        bVar3 = write_codepoint<8ul,char,fmt::v11::basic_appender<char>>(out,'U',escape->cp);
        return (basic_appender<char>)bVar3.container;
      }
      s = escape->begin;
      count = to_unsigned<long>((long)escape->end - (long)escape->begin);
      basic_string_view<char>::basic_string_view((basic_string_view<char> *)&__begin0,s,count);
      local_68 = (basic_string_view<char> *)&__begin0;
      __end0 = basic_string_view<char>::begin(local_68);
      pcStack_88 = basic_string_view<char>::end(local_68);
      for (; __end0 != pcStack_88; __end0 = __end0 + 1) {
        local_89 = *__end0;
        local_a0 = escape_local;
        local_98 = (buffer<char> *)
                   write_codepoint<2ul,char,fmt::v11::basic_appender<char>>
                             ((basic_appender<char>)escape_local,'x',(uint)local_89);
        escape_local = (find_escape_result<char> *)local_98;
      }
      return (basic_appender<char>)(basic_appender<char>)escape_local;
    }
    local_48 = basic_appender<char>::operator++((basic_appender<char> *)&escape_local,0);
    pbVar2 = basic_appender<char>::operator*(&local_48);
    basic_appender<char>::operator=(pbVar2,'\\');
  }
  c_00 = local_21;
  local_a8 = basic_appender<char>::operator++((basic_appender<char> *)&escape_local,0);
  pbVar2 = basic_appender<char>::operator*(&local_a8);
  basic_appender<char>::operator=(pbVar2,c_00);
  return (basic_appender<char>)(basic_appender<char>)escape_local;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':  FMT_FALLTHROUGH;
  case '\'': FMT_FALLTHROUGH;
  case '\\': *out++ = static_cast<Char>('\\'); break;
  default:
    if (escape.cp < 0x100) return write_codepoint<2, Char>(out, 'x', escape.cp);
    if (escape.cp < 0x10000)
      return write_codepoint<4, Char>(out, 'u', escape.cp);
    if (escape.cp < 0x110000)
      return write_codepoint<8, Char>(out, 'U', escape.cp);
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}